

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dtoa.cc
# Opt level: O2

void TestDtoaCorners(void)

{
  char *pcVar1;
  char *buffer;
  char *pcVar2;
  int *piVar3;
  int *length_00;
  bool sign;
  int point;
  int length;
  char buffer_container [100];
  
  buffer = buffer_container;
  length_00 = &length;
  piVar3 = length_00;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,PRECISION,0,buffer,100,&sign,length_00,&point);
  pcVar2 = (char *)(ulong)(uint)length;
  CheckEqualsHelper((char *)0x192,0xc166fe,(char *)0x0,0xc19e51,pcVar2,(int)piVar3);
  pcVar1 = buffer;
  CheckEqualsHelper((char *)0x193,0xc0ce76,"",buffer,pcVar2,(char *)piVar3);
  CheckHelper((char *)0x194,0xc19cd8,(char *)(ulong)(sign ^ 1),SUB81(pcVar1,0));
  piVar3 = length_00;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (1.0,PRECISION,0,buffer,100,&sign,length_00,&point);
  pcVar2 = (char *)(ulong)(uint)length;
  CheckEqualsHelper((char *)0x197,0xc166fe,(char *)0x0,0xc19e51,pcVar2,(int)piVar3);
  pcVar1 = buffer;
  CheckEqualsHelper((char *)0x198,0xc0ce76,"",buffer,pcVar2,(char *)piVar3);
  CheckHelper((char *)0x199,0xc19cd8,(char *)(ulong)(sign ^ 1),SUB81(pcVar1,0));
  piVar3 = length_00;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,FIXED,0,buffer,100,&sign,length_00,&point);
  pcVar2 = (char *)(ulong)(uint)length;
  CheckEqualsHelper((char *)0x19c,0xc1c1d3,(char *)0x1,0xc19e51,pcVar2,(int)piVar3);
  pcVar1 = buffer;
  CheckEqualsHelper((char *)0x19d,0xc08043,"0",buffer,pcVar2,(char *)piVar3);
  CheckHelper((char *)0x19e,0xc19cd8,(char *)(ulong)(sign ^ 1),SUB81(pcVar1,0));
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (1.0,FIXED,0,buffer,100,&sign,length_00,&point);
  pcVar1 = (char *)(ulong)(uint)length;
  CheckEqualsHelper((char *)0x1a1,0xc1c1d3,(char *)0x1,0xc19e51,pcVar1,(int)length_00);
  CheckEqualsHelper((char *)0x1a2,0xc080d3,"1",buffer,pcVar1,(char *)length_00);
  CheckHelper((char *)0x1a3,0xc19cd8,(char *)(ulong)(sign ^ 1),SUB81(buffer,0));
  return;
}

Assistant:

TEST(DtoaCorners) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool sign;
  int length;
  int point;

  DoubleToAscii(0.0, PRECISION, 0, buffer, &sign, &length, &point);
  CHECK_EQ(0, length);
  CHECK_EQ("", buffer.start());
  CHECK(!sign);

  DoubleToAscii(1.0, PRECISION, 0, buffer, &sign, &length, &point);
  CHECK_EQ(0, length);
  CHECK_EQ("", buffer.start());
  CHECK(!sign);

  DoubleToAscii(0.0, FIXED, 0, buffer, &sign, &length, &point);
  CHECK_EQ(1, length);
  CHECK_EQ("0", buffer.start());
  CHECK(!sign);

  DoubleToAscii(1.0, FIXED, 0, buffer, &sign, &length, &point);
  CHECK_EQ(1, length);
  CHECK_EQ("1", buffer.start());
  CHECK(!sign);
}